

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::SetSideOrder
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,int side,int order)

{
  int64_t iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  TPZConnect *this_00;
  long *plVar6;
  TPZCompMesh *pTVar7;
  
  iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x250))(this,0,side);
  if (-1 < iVar2) {
    iVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))(this);
    if (iVar2 <= iVar3) {
      this_00 = (TPZConnect *)
                (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0xa8))(this,iVar2);
      (this_00->field_2).fCompose.fOrder = (uchar)order;
      iVar1 = this_00->fSequenceNumber;
      plVar6 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                              super_TPZInterpolatedElement.
                                              super_TPZInterpolationSpace.super_TPZCompEl + 0xb8))
                                 (this);
      if (plVar6 == (long *)0x0) {
        iVar3 = 1;
      }
      else {
        iVar3 = (**(code **)(*plVar6 + 0x78))(plVar6);
      }
      TPZConnect::SetNState(this_00,iVar3);
      uVar4 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x260))(this,iVar2,order);
      this_00->fNShape = uVar4;
      pTVar7 = TPZCompEl::Mesh((TPZCompEl *)this);
      TPZBlock::Set(&pTVar7->fBlock,(int)iVar1,uVar4 * iVar3,-1);
      return;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"TPZCompElHDiv::SetSideOrder. Bad paramenter side "
                          );
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,side);
  poVar5 = std::operator<<(poVar5," order ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,order);
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SetSideOrder(int side, int order){
	int connectaux= SideConnectLocId(0,side);
	if(connectaux<0 || connectaux > this-> NConnects()) {
		PZError << "TPZCompElHDiv::SetSideOrder. Bad paramenter side " << side << " order " << order << std::endl;
#ifdef PZ_LOG
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " Bad side or order " << side << " order " << order;
		LOGPZ_DEBUG(logger,sout.str())
#endif
		return;
	}
	TPZConnect &c = this->Connect(connectaux);
    c.SetOrder(order,this->fConnectIndexes[connectaux]);
    int64_t seqnum = c.SequenceNumber();
    int nvar = 1;
    TPZMaterial * mat =this-> Material();
    if(mat) nvar = mat->NStateVariables();
    c.SetNState(nvar);
    int nshape =this->NConnectShapeF(connectaux,order);
    c.SetNShape(nshape);
	this-> Mesh()->Block().Set(seqnum,nshape*nvar);
}